

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O2

ostream * avro::operator<<(ostream *os,indent x)

{
  int iVar1;
  bool bVar2;
  allocator<char> local_19;
  
  if ((operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_),
     iVar1 != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_,"    ",&local_19
              );
    __cxa_atexit(std::__cxx11::string::~string,
                 &operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_);
  }
  while (bVar2 = x.d != 0, x.d = x.d + -1, bVar2) {
    std::operator<<(os,(string *)&operator<<(std::ostream&,avro::indent)::spaces_abi_cxx11_);
  }
  return os;
}

Assistant:

std::ostream& operator <<(std::ostream &os, indent x)
{
    static const std::string spaces("    ");
    while(x.d--) {
        os << spaces; 
    }
    return os;
}